

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  if (ptr == end) {
    return -1;
  }
  bVar1 = ptr[1];
  iVar6 = 0;
  pbVar5 = (byte *)ptr;
  iVar7 = iVar6;
  if (bVar1 < 0xdc) {
    if (bVar1 - 0xd8 < 4) {
LAB_0015aba2:
      iVar7 = 0;
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      goto switchD_0015acad_caseD_8;
    }
    if (bVar1 != 0) goto LAB_0015ac12;
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
    if (bVar2 < 0x13) {
      if (bVar2 == 5) {
        if ((long)end - (long)ptr < 2) {
          return -2;
        }
        goto switchD_0015acad_caseD_8;
      }
      if (bVar2 == 6) {
        if ((long)end - (long)ptr < 3) {
          return -2;
        }
        goto switchD_0015acad_caseD_8;
      }
      if (bVar2 != 7) goto switchD_0015acad_caseD_8;
      goto LAB_0015aba2;
    }
    if (bVar2 < 0x18) {
      if (bVar2 == 0x13) {
        pbVar5 = (byte *)(ptr + 2);
        if (pbVar5 == (byte *)end) {
          return -1;
        }
        iVar7 = 0;
        if (ptr[3] == '\0') {
          if ((ulong)*pbVar5 == 0x78) {
            pbVar5 = (byte *)(ptr + 4);
            if (pbVar5 == (byte *)end) {
              return -1;
            }
            iVar7 = iVar6;
            if ((ptr[5] == '\0') &&
               ((*(byte *)((long)enc[1].scanners + (ulong)*pbVar5) & 0xfe) == 0x18)) {
              pbVar5 = (byte *)(ptr + 6);
              while( true ) {
                if (pbVar5 == (byte *)end) {
                  return -1;
                }
                if (pbVar5[1] != 0) goto switchD_0015acad_caseD_8;
                bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar5);
                if (1 < bVar1 - 0x18) break;
                pbVar5 = pbVar5 + 2;
              }
              if (bVar1 == 0x12) {
                pbVar5 = pbVar5 + 2;
                iVar7 = 10;
              }
            }
          }
          else {
            iVar7 = iVar6;
            if (*(char *)((long)enc[1].scanners + (ulong)*pbVar5) == '\x19') {
              pbVar4 = (byte *)(ptr + 4);
              do {
                pbVar5 = pbVar4;
                if (pbVar5 == (byte *)end) {
                  return -1;
                }
                if (pbVar5[1] != 0) goto switchD_0015acad_caseD_8;
                cVar3 = *(char *)((long)enc[1].scanners + (ulong)*pbVar5);
                pbVar4 = pbVar5 + 2;
              } while (cVar3 == '\x19');
              if (cVar3 == '\x12') {
                pbVar5 = pbVar5 + 2;
                iVar7 = 10;
              }
            }
          }
        }
        goto switchD_0015acad_caseD_8;
      }
      if (bVar2 != 0x16) goto switchD_0015acad_caseD_8;
    }
    else if (bVar2 != 0x18) {
      if (bVar2 != 0x1d) goto switchD_0015acad_caseD_8;
      goto LAB_0015ac12;
    }
  }
  else {
    if ((bVar1 - 0xdc < 4) || ((bVar1 == 0xff && (0xfd < (byte)*ptr))))
    goto switchD_0015acad_caseD_8;
LAB_0015ac12:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)((byte)*ptr >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5)) >>
         ((byte)*ptr & 0x1f) & 1) == 0) goto switchD_0015acad_caseD_8;
  }
  pbVar5 = (byte *)(ptr + 2);
  if (pbVar5 == (byte *)end) {
    return -1;
  }
  lVar8 = (long)end - (long)ptr;
  while( true ) {
    lVar8 = lVar8 + -2;
    bVar1 = pbVar5[1];
    if (bVar1 < 0xdc) break;
    if (bVar1 == 0xff) {
      if (0xfd < *pbVar5) goto switchD_0015acad_caseD_8;
    }
    else if (bVar1 - 0xdc < 4) goto switchD_0015acad_caseD_8;
switchD_0015acad_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(*pbVar5 >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5))
         >> (*pbVar5 & 0x1f) & 1) == 0) goto switchD_0015acad_caseD_8;
switchD_0015acad_caseD_16:
    pbVar5 = pbVar5 + 2;
    if (pbVar5 == (byte *)end) {
      return -1;
    }
  }
  if (bVar1 == 0) {
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar5)) {
    case 5:
      if (lVar8 < 2) {
        return -2;
      }
      goto switchD_0015acad_caseD_8;
    case 6:
      if (lVar8 < 3) {
        return -2;
      }
      goto switchD_0015acad_caseD_8;
    case 7:
      goto switchD_0015acad_caseD_7;
    default:
      goto switchD_0015acad_caseD_8;
    case 0x12:
      pbVar5 = pbVar5 + 2;
      iVar7 = 9;
      goto switchD_0015acad_caseD_8;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_0015acad_caseD_16;
    case 0x1d:
      goto switchD_0015acad_caseD_1d;
    }
  }
  if (3 < bVar1 - 0xd8) goto switchD_0015acad_caseD_1d;
switchD_0015acad_caseD_7:
  if (lVar8 < 4) {
    return -2;
  }
switchD_0015acad_caseD_8:
  *nextTokPtr = (char *)pbVar5;
  return iVar7;
}

Assistant:

static
int PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}